

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_hash_set.c
# Opt level: O1

_Bool TIFFHashSetRehash(TIFFHashSet *set)

{
  int iVar1;
  _TIFFList *p_Var2;
  TIFFList *pTVar3;
  TIFFList **ppTVar4;
  unsigned_long uVar5;
  ulong uVar6;
  long lVar7;
  
  iVar1 = anPrimes[set->nIndiceAllocatedSize];
  ppTVar4 = (TIFFList **)calloc(8,(long)iVar1);
  if (ppTVar4 != (TIFFList **)0x0) {
    if (0 < set->nAllocatedSize) {
      lVar7 = 0;
      do {
        pTVar3 = set->tabList[lVar7];
        while (pTVar3 != (TIFFList *)0x0) {
          uVar5 = (*set->fnHashFunc)(pTVar3->pData);
          uVar6 = uVar5 % (ulong)(long)iVar1;
          p_Var2 = pTVar3->psNext;
          pTVar3->psNext = ppTVar4[uVar6];
          ppTVar4[uVar6] = pTVar3;
          pTVar3 = p_Var2;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < set->nAllocatedSize);
    }
    free(set->tabList);
    set->tabList = ppTVar4;
    set->nAllocatedSize = iVar1;
    set->bRehash = false;
  }
  return ppTVar4 != (TIFFList **)0x0;
}

Assistant:

static bool TIFFHashSetRehash(TIFFHashSet *set)
{
    int nNewAllocatedSize = anPrimes[set->nIndiceAllocatedSize];
    TIFFList **newTabList =
        (TIFFList **)(calloc(sizeof(TIFFList *), nNewAllocatedSize));
    if (newTabList == NULL)
        return false;
#ifdef HASH_DEBUG
    TIFFDebug("TIFFHASH",
              "hashSet=%p, nSize=%d, nCollisions=%d, "
              "fCollisionRate=%.02f",
              set, set->nSize, set->nCollisions,
              set->nCollisions * 100.0 / set->nSize);
    set->nCollisions = 0;
#endif
    for (int i = 0; i < set->nAllocatedSize; i++)
    {
        TIFFList *cur = set->tabList[i];
        while (cur)
        {
            const unsigned long nNewHashVal =
                set->fnHashFunc(cur->pData) % nNewAllocatedSize;
#ifdef HASH_DEBUG
            if (newTabList[nNewHashVal])
                set->nCollisions++;
#endif
            TIFFList *psNext = cur->psNext;
            cur->psNext = newTabList[nNewHashVal];
            newTabList[nNewHashVal] = cur;
            cur = psNext;
        }
    }
    free(set->tabList);
    set->tabList = newTabList;
    set->nAllocatedSize = nNewAllocatedSize;
    set->bRehash = false;
    return true;
}